

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O0

PackedFile * __thiscall
Assimp::Blender::Structure::_allocate<Assimp::Blender::PackedFile>
          (Structure *this,shared_ptr<Assimp::Blender::PackedFile> *out,size_t *s)

{
  PackedFile *this_00;
  element_type *peVar1;
  shared_ptr<Assimp::Blender::PackedFile> local_30;
  size_t *local_20;
  size_t *s_local;
  shared_ptr<Assimp::Blender::PackedFile> *out_local;
  Structure *this_local;
  
  local_20 = s;
  s_local = (size_t *)out;
  out_local = (shared_ptr<Assimp::Blender::PackedFile> *)this;
  this_00 = (PackedFile *)operator_new(0x28);
  this_00->size = 0;
  this_00->seek = 0;
  (this_00->data).super___shared_ptr<Assimp::Blender::FileOffset,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this_00->super_ElemBase)._vptr_ElemBase = (_func_int **)0x0;
  (this_00->super_ElemBase).dna_type = (char *)0x0;
  (this_00->data).super___shared_ptr<Assimp::Blender::FileOffset,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  PackedFile::PackedFile(this_00);
  ::std::shared_ptr<Assimp::Blender::PackedFile>::shared_ptr<Assimp::Blender::PackedFile,void>
            (&local_30,this_00);
  ::std::shared_ptr<Assimp::Blender::PackedFile>::operator=
            ((shared_ptr<Assimp::Blender::PackedFile> *)s_local,&local_30);
  ::std::shared_ptr<Assimp::Blender::PackedFile>::~shared_ptr(&local_30);
  *local_20 = 1;
  peVar1 = ::std::__shared_ptr<Assimp::Blender::PackedFile,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<Assimp::Blender::PackedFile,_(__gnu_cxx::_Lock_policy)2> *)
                      s_local);
  return peVar1;
}

Assistant:

T* _allocate(std::shared_ptr<T>& out, size_t& s) const {
        out = std::shared_ptr<T>(new T());
        s = 1;
        return out.get();
    }